

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void build_quoted_str(char *dstbuf,char *src,wchar_t qu)

{
  wchar_t wVar1;
  size_t sVar2;
  char *p;
  
  sVar2 = utf8_ptr::s_putch(dstbuf,qu);
  p = dstbuf + sVar2;
  while( true ) {
    wVar1 = utf8_ptr::s_getch(src);
    if (wVar1 == L'\0') break;
    wVar1 = utf8_ptr::s_getch(src);
    if (wVar1 == L'\\' || wVar1 == qu) {
      *p = '\\';
      p = p + 1;
    }
    sVar2 = utf8_ptr::s_putch(p,wVar1);
    p = p + sVar2;
    src = (char *)((byte *)src +
                  (ulong)((((byte)*src >> 5 & 1) != 0) + 1 & (uint)((byte)*src >> 7) * 3) + 1);
  }
  sVar2 = utf8_ptr::s_putch(p,qu);
  p[sVar2] = '\0';
  return;
}

Assistant:

static void build_quoted_str(char *dstbuf, const char *src, wchar_t qu)
{
    utf8_ptr p;
    utf8_ptr dst;

    /* scan the source string for escapable characters */
    for (p.set((char *)src), dst.set(dstbuf), dst.setch(qu) ;
         p.getch() != '\0' ; p.inc())
    {
        wchar_t ch;

        /* get this source character */
        ch = p.getch();

        /* add a quote if we have a backslash or the quote character */
        if (ch == '\\' || ch == qu)
        {
            /* add a backslash to escape the character */
            dst.setch('\\');
        }

        /* add the character */
        dst.setch(ch);
    }

    /* add the close quote and trailing null */
    dst.setch(qu);
    dst.setch('\0');
}